

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.cpp
# Opt level: O0

wostream * Centaurus::printc(wostream *os,char ch)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t local_68 [2];
  wchar_t buf [16];
  char ch_local;
  wostream *os_local;
  
  iVar1 = isgraph((uint)(byte)ch);
  if (iVar1 == 0) {
    swprintf(local_68,0x10,L"\\\\x%0X",(ulong)(byte)ch);
    os_local = std::operator<<(os,local_68);
  }
  else if (ch == '\"') {
    os_local = std::operator<<(os,L"\\\"");
  }
  else if (ch == '\\') {
    os_local = std::operator<<(os,L"\\\\");
  }
  else {
    wVar2 = std::wios::widen((char)os + (char)*(undefined8 *)(*(long *)os + -0x18));
    os_local = std::operator<<(os,wVar2);
  }
  return os_local;
}

Assistant:

static std::wostream& printc(std::wostream& os, char ch)
{
	if (!isgraph(ch))
	{
		wchar_t buf[16];
		swprintf(buf, 16, L"\\\\x%0X", (int)ch);
		return os << buf;
	}
	else
	{
		switch (ch)
		{
		case '"':
			return os << L"\\\"";
		case '\\':
			return os << L"\\\\";
		default:
			return os << os.widen(ch);
		}
	}
}